

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O3

void fy_emit_node_comment
               (fy_emitter *emit,fy_node *fyn,int flags,int indent,fy_comment_placement placement)

{
  fy_token *fyt;
  long lVar1;
  
  if (((fyn != (fy_node *)0x0) && (placement < fycp_max)) &&
     ((emit->cfg->flags & FYECF_OUTPUT_COMMENTS) != FYECF_DOC_END_MARK_AUTO)) {
    switch(fyn->field_0x34 & 3) {
    case 0:
      lVar1 = 0x48;
      break;
    default:
      lVar1 = 0x58;
      break;
    case 3:
      goto switchD_001259c6_caseD_3;
    }
    fyt = *(fy_token **)((long)&(fyn->node).next + lVar1);
    if (fyt != (fy_token *)0x0) {
      fy_emit_token_comment(emit,fyt,0x1461e0,indent,placement);
      return;
    }
  }
switchD_001259c6_caseD_3:
  return;
}

Assistant:

void fy_emit_node_comment(struct fy_emitter *emit, struct fy_node *fyn, int flags, int indent,
                          enum fy_comment_placement placement) {
    struct fy_token *fyt;

    if (!fy_emit_output_comments(emit) || (unsigned int) placement >= fycp_max)
        return;

    fyt = fy_node_value_token(fyn);
    if (!fyt)
        return;

    fy_emit_token_comment(emit, fyt, flags, indent, placement);
}